

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DoFilter2_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int thresh)

{
  ulong uVar1;
  undefined8 *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  ulong *in_RDI;
  __m128i q1s;
  __m128i p1s;
  __m128i sign_bit;
  __m128i mask;
  __m128i a;
  undefined7 in_stack_fffffffffffffe70;
  ulong uVar2;
  __m128i *fl;
  __m128i *in_stack_fffffffffffffea8;
  __m128i *in_stack_fffffffffffffeb0;
  ulong local_148;
  ulong uStack_140;
  __m128i *local_128;
  __m128i *local_120;
  undefined1 local_109;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  __m128i *palStack_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  ulong local_88;
  __m128i *palStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  __m128i *palStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  __m128i *palStack_40;
  undefined8 local_38;
  ulong uStack_30;
  ulong local_28;
  __m128i *palStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_109 = 0x80;
  local_c9 = 0x80;
  local_ca = 0x80;
  local_cb = 0x80;
  local_cc = 0x80;
  local_cd = 0x80;
  local_ce = 0x80;
  local_cf = 0x80;
  local_d0 = 0x80;
  local_d1 = 0x80;
  local_d2 = 0x80;
  local_d3 = 0x80;
  local_d4 = 0x80;
  local_d5 = 0x80;
  local_d6 = 0x80;
  local_d7 = 0x80;
  local_d8 = 0x80;
  uVar2 = 0x8080808080808080;
  fl = (__m128i *)0x8080808080808080;
  local_18 = *in_RDI;
  uStack_10 = in_RDI[1];
  local_38 = *in_RCX;
  uStack_30 = in_RCX[1];
  local_128 = in_RDX;
  local_120 = in_RSI;
  local_e8 = uVar2;
  palStack_e0 = fl;
  local_48 = uVar2;
  palStack_40 = fl;
  local_28 = uVar2;
  palStack_20 = fl;
  NeedsFilter_SSE2((__m128i *)0x8080808080808080,(__m128i *)(uStack_10 ^ 0x8080808080808080),
                   (__m128i *)(local_18 ^ 0x8080808080808080),
                   (__m128i *)(uStack_30 ^ 0x8080808080808080),
                   (uint)((ulong)local_38 >> 0x20) ^ 0x80808080,
                   (__m128i *)CONCAT17(0x80,in_stack_fffffffffffffe70));
  local_58 = (*local_120)[0];
  uStack_50 = (*local_120)[1];
  (*local_120)[0] = local_58 ^ uVar2;
  (*local_120)[1] = uStack_50 ^ (ulong)fl;
  local_78 = (*local_128)[0];
  uStack_70 = (*local_128)[1];
  (*local_128)[0] = local_78 ^ uVar2;
  (*local_128)[1] = uStack_70 ^ (ulong)fl;
  local_88 = uVar2;
  palStack_80 = fl;
  local_68 = uVar2;
  palStack_60 = fl;
  GetBaseDelta_SSE2((__m128i *)&stack0xfffffffffffffe88,local_120,local_128,
                    (__m128i *)&stack0xfffffffffffffe78,(__m128i *)&local_148);
  local_f8 = local_148;
  uStack_f0 = uStack_140;
  local_148 = local_148 & (ulong)in_stack_fffffffffffffea8;
  uStack_140 = uStack_140 & (ulong)in_stack_fffffffffffffeb0;
  DoSimpleFilter_SSE2(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,fl);
  uVar1 = (*local_120)[1];
  (*local_120)[0] = (*local_120)[0] ^ uVar2;
  (*local_120)[1] = uVar1 ^ (ulong)fl;
  uVar1 = (*local_128)[1];
  (*local_128)[0] = (*local_128)[0] ^ uVar2;
  (*local_128)[1] = uVar1 ^ (ulong)fl;
  return;
}

Assistant:

static WEBP_INLINE void DoFilter2_SSE2(__m128i* const p1, __m128i* const p0,
                                       __m128i* const q0, __m128i* const q1,
                                       int thresh) {
  __m128i a, mask;
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  // convert p1/q1 to int8_t (for GetBaseDelta_SSE2)
  const __m128i p1s = _mm_xor_si128(*p1, sign_bit);
  const __m128i q1s = _mm_xor_si128(*q1, sign_bit);

  NeedsFilter_SSE2(p1, p0, q0, q1, thresh, &mask);

  FLIP_SIGN_BIT2(*p0, *q0);
  GetBaseDelta_SSE2(&p1s, p0, q0, &q1s, &a);
  a = _mm_and_si128(a, mask);     // mask filter values we don't care about
  DoSimpleFilter_SSE2(p0, q0, &a);
  FLIP_SIGN_BIT2(*p0, *q0);
}